

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationDataBuilder::encodeExpansion
          (CollationDataBuilder *this,int64_t *ces,int32_t length,UErrorCode *errorCode)

{
  int iVar1;
  int iVar2;
  int64_t *piVar3;
  int64_t iVar4;
  UBool UVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int64_t *piVar11;
  ulong uVar12;
  bool bVar13;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  iVar1 = (this->ce64s).count;
  uVar6 = iVar1 - length;
  uVar7 = uVar6 >> 0x1f;
  if (-1 < (int)uVar6) {
    piVar3 = (this->ce64s).elements;
    uVar10 = (ulong)uVar6;
    uVar12 = 0;
    piVar11 = piVar3;
    do {
      if ((long)uVar12 < (long)iVar1) {
        lVar8 = piVar3[uVar12];
      }
      else {
        lVar8 = 0;
      }
      if (*ces == lVar8) {
        if (0x7ffff < uVar12) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
          uVar6 = 0;
          break;
        }
        bVar13 = length == 1;
        if (length != 1) {
          uVar9 = 1;
          do {
            if ((int)uVar12 + (int)uVar9 < iVar1) {
              lVar8 = piVar11[uVar9];
            }
            else {
              lVar8 = 0;
            }
            if (lVar8 != ces[uVar9]) goto LAB_0022c2ce;
            uVar9 = uVar9 + 1;
            bVar13 = (uint)length == uVar9;
          } while (!bVar13);
        }
        uVar6 = (int)uVar12 << 0xd | length << 8 | 0xc6;
LAB_0022c2ce:
        if (bVar13) break;
      }
      bVar13 = uVar10 <= uVar12;
      uVar12 = uVar12 + 1;
      uVar7 = (uint)bVar13;
      piVar11 = piVar11 + 1;
    } while (uVar12 != (iVar1 - length) + 1);
  }
  if (uVar7 != 0) {
    if (iVar1 < 0x80000) {
      if (0 < length) {
        uVar12 = 0;
        do {
          iVar4 = ces[uVar12];
          iVar2 = (this->ce64s).count;
          if (((-2 < iVar2) && (iVar2 < (this->ce64s).capacity)) ||
             (UVar5 = UVector64::expandCapacity(&this->ce64s,iVar2 + 1,errorCode), UVar5 != '\0')) {
            iVar2 = (this->ce64s).count;
            (this->ce64s).elements[iVar2] = iVar4;
            (this->ce64s).count = iVar2 + 1;
          }
          uVar12 = uVar12 + 1;
        } while ((uint)length != uVar12);
      }
      uVar6 = length << 8 | iVar1 << 0xd | 0xc6;
    }
    else {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
      uVar6 = 0;
    }
  }
  return uVar6;
}

Assistant:

uint32_t
CollationDataBuilder::encodeExpansion(const int64_t ces[], int32_t length, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    // See if this sequence of CEs has already been stored.
    int64_t first = ces[0];
    int32_t ce64sMax = ce64s.size() - length;
    for(int32_t i = 0; i <= ce64sMax; ++i) {
        if(first == ce64s.elementAti(i)) {
            if(i > Collation::MAX_INDEX) {
                errorCode = U_BUFFER_OVERFLOW_ERROR;
                return 0;
            }
            for(int32_t j = 1;; ++j) {
                if(j == length) {
                    return Collation::makeCE32FromTagIndexAndLength(
                            Collation::EXPANSION_TAG, i, length);
                }
                if(ce64s.elementAti(i + j) != ces[j]) { break; }
            }
        }
    }
    // Store the new sequence.
    int32_t i = ce64s.size();
    if(i > Collation::MAX_INDEX) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return 0;
    }
    for(int32_t j = 0; j < length; ++j) {
        ce64s.addElement(ces[j], errorCode);
    }
    return Collation::makeCE32FromTagIndexAndLength(Collation::EXPANSION_TAG, i, length);
}